

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

int sat_solver2_check_watched(sat_solver2 *s)

{
  int *piVar1;
  clause *pcVar2;
  long lVar3;
  uint uVar4;
  int k;
  ulong uVar5;
  veci *pvVar6;
  long lVar7;
  long lVar8;
  int claSat [2];
  int local_38 [2];
  
  local_38[0] = 0;
  local_38[1] = 0;
  lVar7 = 0;
  do {
    if (SBORROW8(lVar7,(long)s->size * 2) == lVar7 + (long)s->size * -2 < 0) {
      return 0;
    }
    pvVar6 = s->wlists;
    piVar1 = pvVar6[lVar7].ptr;
    k = 0;
    for (lVar8 = 0; lVar8 < pvVar6[lVar7].size; lVar8 = lVar8 + 1) {
      pcVar2 = Sat_MemClauseHand(&s->Mem,piVar1[lVar8]);
      uVar4 = (uint)*pcVar2 >> 0xb;
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        if (((uint)pcVar2[uVar5 + 1] & 1) == (int)s->assigns[(int)pcVar2[uVar5 + 1] >> 1]) {
          if (uVar4 != (uint)uVar5) {
            local_38[(uint)*pcVar2 & 1] = local_38[(uint)*pcVar2 & 1] + 1;
            goto LAB_00714efb;
          }
          break;
        }
      }
      lVar3 = (long)k;
      k = k + 1;
      piVar1[lVar3] = piVar1[lVar8];
LAB_00714efb:
      pvVar6 = s->wlists;
    }
    veci_resize(pvVar6 + lVar7,k);
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int sat_solver2_check_watched( sat_solver2* s )
{
    clause * c;
    int i, k, j, m;
    int claSat[2] = {0};
    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        int * pArray = veci_begin(&s->wlists[i]);
        for ( m = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            c = clause2_read(s, pArray[k]);
            for ( j = 0; j < (int)c->size; j++ )
                if ( var_value(s, lit_var(c->lits[j])) == lit_sign(c->lits[j]) ) // true lit
                    break;
            if ( j == (int)c->size )
            {
                pArray[m++] = pArray[k];
                continue;
            }
            claSat[c->lrn]++;
        }
        veci_resize(&s->wlists[i],m);
        if ( m == 0 )
        {
//            s->wlists[i].cap = 0;
//            s->wlists[i].size = 0;
//            ABC_FREE( s->wlists[i].ptr );
        }
    }
//    printf( "\nClauses = %d  (Sat = %d).  Learned = %d  (Sat = %d).\n",
//        s->stats.clauses, claSat[0], s->stats.learnts, claSat[1] );
    return 0;
}